

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

void __thiscall Server::Private::clear(Private *this)

{
  TimerImpl *local_20;
  long local_18;
  
  Socket::Poll::clear(&this->_sockets);
  MultiMap<long,_Server::Private::TimerImpl_*>::clear(&this->_queuedTimers);
  PoolList<Server::Private::ListenerImpl>::clear(&this->_listeners);
  PoolList<Server::Private::EstablisherImpl>::clear(&this->_establishers);
  PoolList<Server::Private::ClientImpl>::clear(&this->_clients);
  PoolList<Server::Private::TimerImpl>::clear(&this->_timers);
  PoolList<Server::Private::Resolver>::clear(&this->_resolvers);
  HashSet<Server::Private::ClientImpl_*>::clear(&this->_closingClients);
  local_18 = 0;
  local_20 = (TimerImpl *)0x0;
  MultiMap<long,_Server::Private::TimerImpl_*>::insert(&this->_queuedTimers,&local_18,&local_20);
  this->_interrupted = false;
  return;
}

Assistant:

void Server::Private::clear()
{
  _sockets.clear();
  _queuedTimers.clear();
  _listeners.clear();
  _establishers.clear();
  _clients.clear();
  _timers.clear();
  _resolvers.clear();
  _closingClients.clear();
  _queuedTimers.insert(0, 0);
  _interrupted = false;
}